

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::read_entry
          (StreamArchive *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t read_size;
  undefined1 local_70 [8];
  ConditionalLockGuard holder;
  undefined1 auStack_58 [4];
  uint32_t out_size;
  Entry entry;
  PayloadReadFlags flags_local;
  void *blob_local;
  size_t *blob_size_local;
  Hash hash_local;
  ResourceTag tag_local;
  StreamArchive *this_local;
  
  if (((this->alive & 1U) == 0) || (this->mode != ReadOnly)) {
    this_local._7_1_ = 0;
  }
  else {
    entry.header.uncompressed_size = flags;
    bVar1 = find_entry(this,tag,hash,(Entry *)auStack_58);
    if (bVar1) {
      if (blob_size == (size_t *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        holder._12_4_ = entry.header.format;
        if ((entry.header.uncompressed_size & 1) != 0) {
          holder._12_4_ = (uint)entry.offset + 0x10;
        }
        if ((blob == (void *)0x0) || ((ulong)(uint)holder._12_4_ <= *blob_size)) {
          *blob_size = (ulong)(uint)holder._12_4_;
          if (blob != (void *)0x0) {
            if ((entry.header.uncompressed_size & 1) == 0) {
              bVar1 = decode_payload(this,blob,(ulong)(uint)holder._12_4_,(Entry *)auStack_58,
                                     (entry.header.uncompressed_size & 2) != 0);
              if (!bVar1) {
                this_local._7_1_ = 0;
                goto LAB_001c8cce;
              }
            }
            else {
              ConditionalLockGuard::ConditionalLockGuard
                        ((ConditionalLockGuard *)local_70,&this->read_lock,
                         (entry.header.uncompressed_size & 2) != 0);
              iVar2 = fseek((FILE *)this->file,_auStack_58 - 0x10,0);
              if (iVar2 < 0) {
                this_local._7_1_ = 0;
                bVar1 = true;
              }
              else {
                sVar3 = fread(blob,1,(ulong)(uint)entry.offset + 0x10,(FILE *)this->file);
                if (sVar3 == (ulong)(uint)entry.offset + 0x10) {
                  bVar1 = false;
                }
                else {
                  this_local._7_1_ = 0;
                  bVar1 = true;
                }
              }
              ConditionalLockGuard::~ConditionalLockGuard((ConditionalLockGuard *)local_70);
              if (bVar1) goto LAB_001c8cce;
            }
          }
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_001c8cce:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if (!alive || mode != DatabaseMode::ReadOnly)
			return false;

		Entry entry;
		if (!find_entry(tag, hash, entry))
			return false;

		if (!blob_size)
			return false;

		uint32_t out_size = (flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0 ?
		                    (entry.header.payload_size + sizeof(PayloadHeaderRaw)) :
		                    entry.header.uncompressed_size;

		if (blob && *blob_size < out_size)
			return false;
		*blob_size = out_size;

		if (blob)
		{
			if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			{
				// Include the header.
				ConditionalLockGuard holder(read_lock, (flags & PAYLOAD_READ_CONCURRENT_BIT) != 0);
				if (fseek(file, entry.offset - sizeof(PayloadHeaderRaw), SEEK_SET) < 0)
					return false;

				size_t read_size = entry.header.payload_size + sizeof(PayloadHeaderRaw);
				if (fread(blob, 1, read_size, file) != read_size)
					return false;
			}
			else
			{
				if (!decode_payload(blob, out_size, entry, (flags & PAYLOAD_READ_CONCURRENT_BIT) != 0))
					return false;
			}
		}

		return true;
	}